

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int tremove(lua_State *L)

{
  lua_Integer def;
  long local_20;
  lua_Integer pos;
  lua_Integer size;
  lua_State *L_local;
  
  checktab(L,1,7);
  def = luaL_len(L,1);
  local_20 = luaL_optinteger(L,2,def);
  if ((local_20 != def) && ((local_20 < 1 || (def + 1 < local_20)))) {
    luaL_argerror(L,1,"position out of bounds");
  }
  lua_geti(L,1,local_20);
  for (; local_20 < def; local_20 = local_20 + 1) {
    lua_geti(L,1,local_20 + 1);
    lua_seti(L,1,local_20);
  }
  lua_pushnil(L);
  lua_seti(L,1,local_20);
  return 1;
}

Assistant:

static int tremove(lua_State *L) {
    lua_Integer size = aux_getn(L, 1, TAB_RW);
    lua_Integer pos = luaL_optinteger(L, 2, size);
    if (pos != size)  /* validate 'pos' if given */
        luaL_argcheck(L, 1 <= pos && pos <= size + 1, 1, "position out of bounds");
    lua_geti(L, 1, pos);  /* result = t[pos] */
    for (; pos < size; pos++) {
        lua_geti(L, 1, pos + 1);
        lua_seti(L, 1, pos);  /* t[pos] = t[pos + 1] */
    }
    lua_pushnil(L);
    lua_seti(L, 1, pos);  /* t[pos] = nil */
    return 1;
}